

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_NodeMffcSizeSupp(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Int_t *vSupp)

{
  int iVar1;
  int iVar2;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaUtil.c"
                  ,0x494,"int Gia_NodeMffcSizeSupp(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  if (((int)(uint)*(undefined8 *)pNode < 0) ||
     (((uint)*(undefined8 *)pNode & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaUtil.c"
                  ,0x495,"int Gia_NodeMffcSizeSupp(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  vSupp->nSize = 0;
  Gia_ManIncrementTravId(p);
  iVar1 = Gia_NodeDeref_rec(p,pNode);
  Gia_NodeCollect_rec(p,pNode + -(*(ulong *)pNode & 0x1fffffff),vSupp);
  Gia_NodeCollect_rec(p,pNode + -((ulong)*(uint *)&pNode->field_0x4 & 0x1fffffff),vSupp);
  iVar2 = Gia_NodeRef_rec(p,pNode);
  if (iVar1 != iVar2) {
    __assert_fail("ConeSize1 == ConeSize2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaUtil.c"
                  ,0x49c,"int Gia_NodeMffcSizeSupp(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  if (-1 < iVar1) {
    return iVar1;
  }
  __assert_fail("ConeSize1 >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaUtil.c"
                ,0x49d,"int Gia_NodeMffcSizeSupp(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

int Gia_NodeMffcSizeSupp( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Int_t * vSupp )
{
    int ConeSize1, ConeSize2;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsAnd(pNode) );
    Vec_IntClear( vSupp );
    Gia_ManIncrementTravId( p );
    ConeSize1 = Gia_NodeDeref_rec( p, pNode );
    Gia_NodeCollect_rec( p, Gia_ObjFanin0(pNode), vSupp );
    Gia_NodeCollect_rec( p, Gia_ObjFanin1(pNode), vSupp );
    ConeSize2 = Gia_NodeRef_rec( p, pNode );
    assert( ConeSize1 == ConeSize2 );
    assert( ConeSize1 >= 0 );
    return ConeSize1;
}